

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::rewrite_load_for_wrapped_row_major
          (CompilerGLSL *this,string *expr,TypeID loaded_type,ID ptr)

{
  bool bVar1;
  SPIRVariable *pSVar2;
  SPIRType *type;
  SPIRType *type_00;
  uint32_t index;
  uint uVar3;
  byte bVar4;
  Bitset decorations;
  undefined4 in_stack_ffffffffffffff78;
  char *local_78;
  Bitset local_70;
  
  pSVar2 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr.id);
  if ((((pSVar2 != (SPIRVariable *)0x0) &&
       (type = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar2->super_IVariant).field_0xc),
       *(int *)&(type->super_IVariant).field_0xc == 0xf)) && (type->storage == StorageClassUniform))
     && (bVar1 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock
                           ), bVar1)) {
    type_00 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         loaded_type.id);
    uVar3._0_1_ = (this->options).es;
    uVar3._1_1_ = (this->options).force_temporary;
    uVar3._2_2_ = *(undefined2 *)&(this->options).field_0x6;
    bVar1 = Compiler::is_matrix(&this->super_Compiler,type_00);
    if (!bVar1) {
      type = type_00;
      uVar3 = 0;
    }
    if ((*(int *)&(type->super_IVariant).field_0xc == 0xf) &&
       ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size != 0)) {
      bVar4 = 0;
      index = 0;
      do {
        Compiler::combined_decoration_for_member(&local_70,&this->super_Compiler,type,index);
        bVar4 = bVar4 | (byte)(((uint)local_70.lower & 0x10) >> 4);
        uVar3 = uVar3 & 0xff;
        if ((local_70.lower & 1) == 0) {
          uVar3 = 0;
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_70.higher._M_h);
        index = index + 1;
      } while (index < (uint)(type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size);
      if (bVar4 != 0) {
        request_workaround_wrapper_overload(this,loaded_type);
        local_78 = "";
        if ((uVar3 & 1) != 0) {
          local_78 = "MP";
        }
        join<char_const(&)[22],char_const*,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  ((string *)&local_70,(spirv_cross *)"spvWorkaroundRowMajor",
                   (char (*) [22])&local_78,(char **)0x379f10,(char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3623fe,
                   (char (*) [2])CONCAT44(loaded_type.id,in_stack_ffffffffffffff78));
        ::std::__cxx11::string::operator=((string *)expr,(string *)&local_70);
        if ((size_type *)local_70.lower != &local_70.higher._M_h._M_bucket_count) {
          operator_delete((void *)local_70.lower);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::rewrite_load_for_wrapped_row_major(std::string &expr, TypeID loaded_type, ID ptr)
{
	// Loading row-major matrices from UBOs on older AMD Windows OpenGL drivers is problematic.
	// To load these types correctly, we must first wrap them in a dummy function which only purpose is to
	// ensure row_major decoration is actually respected.
	auto *var = maybe_get_backing_variable(ptr);
	if (!var)
		return;

	auto &backing_type = get<SPIRType>(var->basetype);
	bool is_ubo = backing_type.basetype == SPIRType::Struct && backing_type.storage == StorageClassUniform &&
	              has_decoration(backing_type.self, DecorationBlock);
	if (!is_ubo)
		return;

	auto *type = &get<SPIRType>(loaded_type);
	bool rewrite = false;
	bool relaxed = options.es;

	if (is_matrix(*type))
	{
		// To avoid adding a lot of unnecessary meta tracking to forward the row_major state,
		// we will simply look at the base struct itself. It is exceptionally rare to mix and match row-major/col-major state.
		// If there is any row-major action going on, we apply the workaround.
		// It is harmless to apply the workaround to column-major matrices, so this is still a valid solution.
		// If an access chain occurred, the workaround is not required, so loading vectors or scalars don't need workaround.
		type = &backing_type;
	}
	else
	{
		// If we're loading a composite, we don't have overloads like these.
		relaxed = false;
	}

	if (type->basetype == SPIRType::Struct)
	{
		// If we're loading a struct where any member is a row-major matrix, apply the workaround.
		for (uint32_t i = 0; i < uint32_t(type->member_types.size()); i++)
		{
			auto decorations = combined_decoration_for_member(*type, i);
			if (decorations.get(DecorationRowMajor))
				rewrite = true;

			// Since we decide on a per-struct basis, only use mediump wrapper if all candidates are mediump.
			if (!decorations.get(DecorationRelaxedPrecision))
				relaxed = false;
		}
	}

	if (rewrite)
	{
		request_workaround_wrapper_overload(loaded_type);
		expr = join("spvWorkaroundRowMajor", (relaxed ? "MP" : ""), "(", expr, ")");
	}
}